

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDF::readTrailer(QPDF *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InputSource *input;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  qpdf_offset_t offset;
  qpdf_offset_t offset_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  QPDF *in_RSI;
  QPDFObjectHandle QVar7;
  string local_108;
  string local_e8;
  pair<QPDFObjectHandle,_bool> local_c8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  offset = (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x20))();
  input = (((in_RSI->m)._M_t.
            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"trailer","");
  _Var2._M_head_impl =
       (in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFParser::parse(&local_c8,input,(string *)local_b0,&(_Var2._M_head_impl)->tokenizer,
                    (StringDecrypter *)0x0,in_RSI,(_Var2._M_head_impl)->in_xref_reconstruction);
  if ((undefined1 *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
  }
  if (local_c8.second == true) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"trailer","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"empty object treated as null","");
    damagedPDF((QPDFExc *)local_b0,in_RSI,&local_108,&local_e8);
    warn(in_RSI,(QPDFExc *)local_b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_002265e8:
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = QPDFObjectHandle::isDictionary(&local_c8.first);
    if (bVar4) {
      _Var2._M_head_impl =
           (in_RSI->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_b0,&(_Var2._M_head_impl)->tokenizer,
                 ((_Var2._M_head_impl)->file).
                 super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &(_Var2._M_head_impl)->last_object_description,true,0);
      paVar1 = &local_108.field_2;
      local_108._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"stream","");
      if ((local_b0._0_4_ == tt_word) && (local_a0._0_8_ == local_108._M_string_length)) {
        if (local_a0._0_8_ == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp((void *)local_b0._8_8_,local_108._M_dataplus._M_p,local_a0._0_8_);
          bVar4 = iVar5 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_allocated_capacity != local_58) {
        operator_delete((void *)local_68._M_allocated_capacity,local_58[0]._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_allocated_capacity != &local_78) {
        operator_delete((void *)local_88._M_allocated_capacity,
                        (ulong)(local_78._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_b0._8_8_ != local_a0 + 8) {
        operator_delete((void *)local_b0._8_8_,local_a0._8_8_ + 1);
      }
      if (bVar4) {
        local_108._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"trailer","");
        offset_00 = (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                               .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                              _M_head_impl)->file).
                                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                + 0x20))();
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"stream keyword found in trailer","");
        damagedPDF((QPDFExc *)local_b0,in_RSI,&local_108,offset_00,&local_e8);
        warn(in_RSI,(QPDFExc *)local_b0);
        QPDFExc::~QPDFExc((QPDFExc *)local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) goto LAB_002265e8;
      }
    }
  }
  InputSource::setLastOffset
            ((((in_RSI->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,offset);
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)
       local_c8.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)
       local_c8.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var6._M_pi = extraout_RDX;
  if ((Members *)
      local_c8.first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (Members *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_c8.first.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + 8);
      *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
      UNLOCK();
      if ((Members *)
          local_c8.first.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (Members *)0x0) goto LAB_002267fe;
    }
    else {
      p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_c8.first.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + 8);
      *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.first.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
LAB_002267fe:
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readTrailer()
{
    qpdf_offset_t offset = m->file->tell();
    auto [object, empty] = QPDFParser::parse(
        *m->file, "trailer", m->tokenizer, nullptr, *this, m->in_xref_reconstruction);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(damagedPDF("trailer", "empty object treated as null"));
    } else if (object.isDictionary() && readToken(*m->file).isWord("stream")) {
        warn(damagedPDF("trailer", m->file->tell(), "stream keyword found in trailer"));
    }
    // Override last_offset so that it points to the beginning of the object we just read
    m->file->setLastOffset(offset);
    return object;
}